

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

Fields * trieste::wf::ops::operator*(Fields *__return_storage_ptr__,Field *fst,Field *snd)

{
  initializer_list<trieste::wf::Field> __l;
  Field *local_b0;
  allocator<trieste::wf::Field> local_85 [13];
  Field *local_78;
  Field local_70;
  Field local_50;
  Token local_30;
  pointer local_28;
  Field *local_20;
  Field *snd_local;
  Field *fst_local;
  
  local_78 = &local_70;
  local_20 = snd;
  snd_local = fst;
  fst_local = (Field *)__return_storage_ptr__;
  Field::Field(local_78,fst);
  local_78 = &local_50;
  Field::Field(local_78,local_20);
  local_30.def = (TokenDef *)&local_70;
  local_28 = (pointer)0x2;
  CLI::std::allocator<trieste::wf::Field>::allocator(local_85);
  __l._M_len = (size_type)local_28;
  __l._M_array = (iterator)local_30.def;
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&__return_storage_ptr__->fields,__l,local_85);
  Token::Token(&__return_storage_ptr__->binding,(TokenDef *)Invalid);
  CLI::std::allocator<trieste::wf::Field>::~allocator(local_85);
  local_b0 = (Field *)&stack0xffffffffffffffd0;
  do {
    local_b0 = local_b0 + -1;
    Field::~Field(local_b0);
  } while (local_b0 != &local_70);
  return __return_storage_ptr__;
}

Assistant:

inline Fields operator*(Field&& fst, const Field& snd)
      {
        return Fields{std::vector<Field>{fst, snd}, Invalid};
      }